

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall
Importer_coverageNestedImportsClearingModels_Test::
~Importer_coverageNestedImportsClearingModels_Test
          (Importer_coverageNestedImportsClearingModels_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, coverageNestedImportsClearingModels)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/nested_components.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));

    EXPECT_EQ(size_t(0), importer->issueCount());

    EXPECT_FALSE(model->hasUnresolvedImports());
    importer->clearImports(model);
    EXPECT_TRUE(model->hasUnresolvedImports());
}